

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O3

int lua_closethread(lua_State *L,lua_State *from)

{
  uint uVar1;
  int iVar2;
  
  if (from == (lua_State *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = (uint)(ushort)from->nCcalls;
  }
  L->nCcalls = uVar1;
  iVar2 = luaE_resetthread(L,(uint)L->status);
  return iVar2;
}

Assistant:

LUA_API int lua_closethread (lua_State *L, lua_State *from) {
  int status;
  lua_lock(L);
  L->nCcalls = (from) ? getCcalls(from) : 0;
  status = luaE_resetthread(L, L->status);
  lua_unlock(L);
  return status;
}